

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O1

void __thiscall
Assimp::StreamWriter<false,_false>::PutString(StreamWriter<false,_false> *this,string *s)

{
  size_type __new_size;
  
  __new_size = s->_M_string_length + this->cursor;
  if ((ulong)((long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) <= __new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->buffer,__new_size);
  }
  memcpy((this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + this->cursor,(s->_M_dataplus)._M_p,s->_M_string_length);
  this->cursor = this->cursor + s->_M_string_length;
  return;
}

Assistant:

void PutString(const std::string& s)
    {
        // as Put(T f) below
        if (cursor + s.size() >= buffer.size()) {
            buffer.resize(cursor + s.size());
        }
        void* dest = &buffer[cursor];
        ::memcpy(dest, s.c_str(), s.size());
        cursor += s.size();
    }